

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O0

Float pbrt::FresnelMoment2(Float eta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  Float r_eta3;
  Float r_eta2;
  Float r_eta;
  Float eta5;
  Float eta4;
  Float eta3;
  Float eta2;
  Float eta_local;
  undefined4 local_4;
  
  fVar1 = eta * eta;
  fVar2 = fVar1 * eta;
  fVar3 = fVar2 * eta;
  if (1.0 <= eta) {
    fVar5 = 1.0 / eta;
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x42353c1c),0),ZEXT416((uint)(fVar5 * fVar5 * fVar5)),
                             SUB6416(ZEXT464(0xc408c21d),0));
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc35ab99a),0),ZEXT416((uint)(fVar5 * fVar5)),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x43e56be7),0),ZEXT416((uint)fVar5),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x43ca474c),0),ZEXT416((uint)eta),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc33d84dd),0),ZEXT416((uint)fVar1),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x425bbb16),0),ZEXT416((uint)fVar2),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc11018b3),0),ZEXT416((uint)fVar3),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f23b107),0),ZEXT416((uint)(fVar3 * eta)),auVar4);
    local_4 = auVar4._0_4_;
  }
  else {
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf5f9db2),0),ZEXT416((uint)eta),
                             SUB6416(ZEXT464(0x3e8d6239),0));
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f8f7564),0),ZEXT416((uint)fVar1),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf26a4a9),0),ZEXT416((uint)fVar2),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da1719f),0),ZEXT416((uint)fVar3),auVar4);
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3d4710cb),0),ZEXT416((uint)(fVar3 * eta)),auVar4);
    local_4 = auVar4._0_4_;
  }
  return local_4;
}

Assistant:

Float FresnelMoment2(Float eta) {
    Float eta2 = eta * eta, eta3 = eta2 * eta, eta4 = eta3 * eta, eta5 = eta4 * eta;
    if (eta < 1) {
        return 0.27614f - 0.87350f * eta + 1.12077f * eta2 - 0.65095f * eta3 +
               0.07883f * eta4 + 0.04860f * eta5;
    } else {
        Float r_eta = 1 / eta, r_eta2 = r_eta * r_eta, r_eta3 = r_eta2 * r_eta;
        return -547.033f + 45.3087f * r_eta3 - 218.725f * r_eta2 + 458.843f * r_eta +
               404.557f * eta - 189.519f * eta2 + 54.9327f * eta3 - 9.00603f * eta4 +
               0.63942f * eta5;
    }
}